

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

Boxed_Value __thiscall chaiscript::const_var(chaiscript *this,bool b)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value *pBVar2;
  Boxed_Value BVar3;
  
  if (const_var(bool)::t == '\0') {
    iVar1 = __cxa_guard_acquire(&const_var(bool)::t);
    if (iVar1 != 0) {
      detail::const_var_impl<bool>((bool *)&const_var::t);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&const_var::t,&__dso_handle);
      __cxa_guard_release(&const_var(bool)::t);
    }
  }
  if (const_var(bool)::f == '\0') {
    iVar1 = __cxa_guard_acquire(&const_var(bool)::f);
    if (iVar1 != 0) {
      detail::const_var_impl<bool>((bool *)&const_var::f);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&const_var::f,&__dso_handle);
      __cxa_guard_release(&const_var(bool)::f);
    }
  }
  pBVar2 = &const_var::f;
  if (b) {
    pBVar2 = &const_var::t;
  }
  std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Boxed_Value const_var(bool b) {
    static const auto t = detail::const_var_impl(true);
    static const auto f = detail::const_var_impl(false);

    if (b) {
      return t;
    } else {
      return f;
    }
  }